

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createTriOp(Builder *this,Op opCode,Id typeId,Id op1,Id op2,Id op3)

{
  Block *this_00;
  value_type vVar1;
  Id resultId;
  reference pvVar2;
  Instruction *this_01;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_88;
  Instruction *local_80;
  Instruction *op;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_68;
  allocator_type local_49;
  undefined1 local_48 [8];
  Vector<Id> operands;
  Id op3_local;
  Id op2_local;
  Id op1_local;
  Id typeId_local;
  Op opCode_local;
  Builder *this_local;
  
  operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = op3;
  if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
    this_01 = (Instruction *)
              Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,opCode));
    resultId = getUniqueId(this);
    Instruction::Instruction(this_01,resultId,typeId,opCode);
    local_80 = this_01;
    Instruction::addIdOperand(this_01,op1);
    Instruction::addIdOperand(local_80,op2);
    Instruction::addIdOperand
              (local_80,operands.
                        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    this_00 = this->buildPoint;
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_88,
               local_80);
    Block::addInstruction(this_00,&local_88);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_88);
    this_local._4_4_ = Instruction::getResultId(local_80);
  }
  else {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_48,3,
               &local_49);
    pvVar2 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                        local_48,0);
    *pvVar2 = op1;
    pvVar2 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                        local_48,1);
    vVar1 = operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    *pvVar2 = op2;
    pvVar2 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                        local_48,2);
    *pvVar2 = vVar1;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector(&local_68);
    this_local._4_4_ =
         createSpecConstantOp
                   (this,opCode,typeId,
                    (vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_48,
                    &local_68);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_68);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_48);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createTriOp(Op opCode, Id typeId, Id op1, Id op2, Id op3)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        dxil_spv::Vector<Id> operands(3);
        operands[0] = op1;
        operands[1] = op2;
        operands[2] = op3;
        return createSpecConstantOp(
            opCode, typeId, operands, dxil_spv::Vector<Id>());
    }
    Instruction* op = new Instruction(getUniqueId(), typeId, opCode);
    op->addIdOperand(op1);
    op->addIdOperand(op2);
    op->addIdOperand(op3);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}